

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall Lowerer::LowerLdArrViewElem(Lowerer *this,Instr *instr)

{
  uint offset;
  Opnd *pOVar1;
  Opnd *pOVar2;
  Opnd *src2;
  Opnd *src1;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  JITTimeFunctionBody *pJVar6;
  undefined4 *puVar7;
  AsmJsJITInfo *this_00;
  Instr *insertBeforeInstr;
  intptr_t pMemLoc;
  IntConstOpnd *newSrc;
  Instr *pIVar8;
  Func *pFVar9;
  IRType IVar10;
  Lowerer *in_stack_ffffffffffffffb0;
  
  pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
  bVar4 = JITTimeFunctionBody::IsAsmJsMode(pJVar6);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2515,"(m_func->GetJITFunctionBody()->IsAsmJsMode())",
                       "m_func->GetJITFunctionBody()->IsAsmJsMode()");
    if (!bVar4) goto LAB_005b309e;
    *puVar7 = 0;
  }
  if (instr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2516,"(instr)","instr");
    if (!bVar4) goto LAB_005b309e;
    *puVar7 = 0;
  }
  if (instr->m_opcode != LdArrViewElem) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2517,"(instr->m_opcode == Js::OpCode::LdArrViewElem)",
                       "instr->m_opcode == Js::OpCode::LdArrViewElem");
    if (!bVar4) goto LAB_005b309e;
    *puVar7 = 0;
  }
  pIVar8 = instr->m_prev;
  pOVar1 = instr->m_src1;
  OVar5 = IR::Opnd::GetKind(pOVar1);
  if (OVar5 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar4) goto LAB_005b309e;
    *puVar7 = 0;
  }
  pOVar1 = *(Opnd **)&pOVar1[1].m_valueType;
  pOVar2 = instr->m_src1;
  OVar5 = IR::Opnd::GetKind(pOVar2);
  if (OVar5 != OpndKindIndir) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
    if (!bVar4) goto LAB_005b309e;
    *puVar7 = 0;
  }
  offset = *(uint *)&pOVar2[2]._vptr_Opnd;
  pOVar2 = instr->m_dst;
  src2 = instr->m_src2;
  if ((int)offset < 0) {
    IVar10 = pOVar2->m_type;
    pFVar9 = this->m_func;
    if (IVar10 == TyFloat64) {
      pMemLoc = ThreadContextInfo::GetDoubleNaNAddr(pFVar9->m_threadContextInfo);
      pFVar9 = this->m_func;
      IVar10 = TyFloat64;
    }
    else {
      if (IVar10 != TyFloat32) {
        newSrc = IR::IntConstOpnd::New(0,IVar10,pFVar9,false);
        goto LAB_005b3042;
      }
      pMemLoc = ThreadContextInfo::GetFloatNaNAddr(pFVar9->m_threadContextInfo);
      pFVar9 = this->m_func;
      IVar10 = TyFloat32;
    }
    newSrc = (IntConstOpnd *)IR::MemRefOpnd::New(pMemLoc,IVar10,pFVar9,AddrOpndKindDynamicMisc);
LAB_005b3042:
    IR::Instr::ReplaceSrc1(instr,&newSrc->super_Opnd);
    if (src2 != (Opnd *)0x0) {
      IR::Instr::FreeSrc2(instr);
    }
    pIVar8 = LowererMD::ChangeToAssign(instr);
    return pIVar8;
  }
  src1 = instr->m_src1;
  if (pOVar1 == (Opnd *)0x0) {
    pJVar6 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
    this_00 = JITTimeFunctionBody::GetAsmJsInfo(pJVar6);
    bVar4 = AsmJsJITInfo::AccessNeedsBoundCheck(this_00,offset);
    if (!bVar4) {
      IR::Instr::UnlinkDst(instr);
      IR::Instr::UnlinkSrc1(instr);
      insertBeforeInstr = instr;
      if (src2 != (Opnd *)0x0) {
        IR::Instr::FreeSrc2(instr);
      }
      goto LAB_005b2fb5;
    }
  }
  if ((pOVar2->m_type == TyFloat32) && (src1->m_type != TyFloat32)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2546,"(!dst->IsFloat32() || src1->IsFloat32())",
                       "!dst->IsFloat32() || src1->IsFloat32()");
    if (!bVar4) goto LAB_005b309e;
    *puVar7 = 0;
  }
  if ((pOVar2->m_type == TyFloat64) && (src1->m_type != TyFloat64)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2547,"(!dst->IsFloat64() || src1->IsFloat64())",
                       "!dst->IsFloat64() || src1->IsFloat64()");
    if (!bVar4) {
LAB_005b309e:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
  }
  insertBeforeInstr = LowererMD::LowerAsmJsLdElemHelper(&this->m_lowererMD,instr);
LAB_005b2fb5:
  InsertMaskableMove(false,true,pOVar2,src1,src2,pOVar1,insertBeforeInstr,in_stack_ffffffffffffffb0)
  ;
  IR::Instr::Remove(instr);
  return pIVar8;
}

Assistant:

IR::Instr *
Lowerer::LowerLdArrViewElem(IR::Instr * instr)
{
#ifdef ASMJS_PLAT
    Assert(m_func->GetJITFunctionBody()->IsAsmJsMode());
    Assert(instr);
    Assert(instr->m_opcode == Js::OpCode::LdArrViewElem);

    IR::Instr * instrPrev = instr->m_prev;

    IR::RegOpnd * indexOpnd = instr->GetSrc1()->AsIndirOpnd()->GetIndexOpnd();
    int32 offset = instr->GetSrc1()->AsIndirOpnd()->GetOffset();

    IR::Opnd * dst = instr->GetDst();
    IR::Opnd * src1 = instr->GetSrc1();
    IR::Opnd * src2 = instr->GetSrc2();

    IR::Instr * done;

    if (offset < 0)
    {
        IR::Opnd * oobValue = nullptr;
        if(dst->IsFloat32())
        {
            oobValue = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetFloatNaNAddr(), TyFloat32, m_func);
        }
        else if(dst->IsFloat64())
        {
            oobValue = IR::MemRefOpnd::New(m_func->GetThreadContextInfo()->GetDoubleNaNAddr(), TyFloat64, m_func);
        }
        else
        {
            oobValue = IR::IntConstOpnd::New(0, dst->GetType(), m_func);
        }
        instr->ReplaceSrc1(oobValue);
        if (src2)
        {
            instr->FreeSrc2();
        }
        return m_lowererMD.ChangeToAssign(instr);
    }
    if (indexOpnd || m_func->GetJITFunctionBody()->GetAsmJsInfo()->AccessNeedsBoundCheck((uint32)offset))
    {
        // CMP indexOpnd, src2(arrSize)
        // JA $helper
        // JMP $load
        // $helper:
        // MOV dst, 0
        // JMP $done
        // $load:
        // MOV dst, src1([arrayBuffer + indexOpnd])
        // $done:

        Assert(!dst->IsFloat32() || src1->IsFloat32());
        Assert(!dst->IsFloat64() || src1->IsFloat64());
        done = m_lowererMD.LowerAsmJsLdElemHelper(instr);
    }
    else
    {
        // any access below 0x10000 is safe
        instr->UnlinkDst();
        instr->UnlinkSrc1();
        if (src2)
        {
            instr->FreeSrc2();
        }
        done = instr;
    }

    InsertMaskableMove(false, true, dst, src1, src2, indexOpnd, done, this);

    instr->Remove();
    return instrPrev;
#else
    Assert(UNREACHED);
    return instr;
#endif
}